

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

size_t ecAddMulA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t k,...)

{
  char in_AL;
  long lVar1;
  byte bVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar6;
  bool bVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  void *in_XMM3_Qa;
  long local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 uStack_88;
  va_list marker;
  
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    uStack_88 = in_XMM2_Qa;
    marker[0].overflow_arg_area = in_XMM3_Qa;
  }
  lVar1 = k * 0x30 + n * ec_d * 8;
  plVar3 = (long *)&stack0x00000008;
  uVar5 = 0x20;
  while (bVar7 = k != 0, k = k - 1, bVar7) {
    if (uVar5 < 0x29) {
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 8;
      plVar4 = (long *)((long)local_d8 + uVar6);
    }
    else {
      plVar4 = plVar3;
      plVar3 = plVar3 + 1;
    }
    uVar6 = *plVar4 << 6;
    bVar2 = 4;
    if ((uVar6 < 0x150) && (bVar2 = 3, uVar6 < 0x78)) {
      bVar2 = 2 - (uVar6 == 0);
    }
    lVar1 = lVar1 + *plVar4 * 0x10 + (n * ec_d << (bVar2 & 0x3f)) * 8 + 8;
  }
  return lVar1 + ec_deep;
}

Assistant:

size_t ecAddMulA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t k, ...)
{
	size_t i, ret;
	va_list marker;
	ret = O_OF_W(ec_d * n);
	ret += 4 * sizeof(size_t) * k;
	ret += 2 * sizeof(word**) * k;
	va_start(marker, k);
	for (i = 0; i < k; ++i)
	{
		size_t m = va_arg(marker, size_t);
		size_t naf_width = ecNAFWidth(B_OF_W(m));
		size_t naf_count = SIZE_1 << (naf_width - 2);
		ret += O_OF_W(2 * m + 1);
		ret += O_OF_W(ec_d * n * naf_count);
	}
	va_end(marker);
	ret += ec_deep;
	return ret;
}